

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5SegIterReverseNewPage(Fts5Index *p,Fts5SegIter *pIter)

{
  int iVar1;
  byte bVar2;
  Fts5Data *p_00;
  Fts5Data *pFVar3;
  ushort uVar4;
  uint uVar5;
  
  sqlite3_free(pIter->pLeaf);
  pIter->pLeaf = (Fts5Data *)0x0;
LAB_001b804d:
  do {
    if (p->rc != 0) {
LAB_001b80e0:
      if (pIter->pLeaf == (Fts5Data *)0x0) {
        return;
      }
      pIter->iEndofDoclist = pIter->pLeaf->nn + 1;
      fts5SegIterReverseInitPage(p,pIter);
      return;
    }
    iVar1 = pIter->iLeafPgno;
    if (iVar1 <= pIter->iTermLeafPgno) goto LAB_001b80e0;
    pIter->iLeafPgno = iVar1 + -1;
    p_00 = fts5DataRead(p,((ulong)(uint)pIter->pSeg->iSegid << 0x25) + (long)iVar1 + -1);
  } while (p_00 == (Fts5Data *)0x0);
  if (pIter->iLeafPgno == pIter->iTermLeafPgno) {
    uVar5 = pIter->iTermLeafOffset;
    if (p_00->szLeaf <= (int)uVar5) goto LAB_001b80a6;
LAB_001b80c4:
    pIter->pLeaf = p_00;
    pIter->iLeafOffset = uVar5;
    pFVar3 = p_00;
  }
  else {
    uVar4 = *(ushort *)p_00->p << 8 | *(ushort *)p_00->p >> 8;
    if (uVar4 != 0) {
      uVar5 = (uint)uVar4;
      goto LAB_001b80c4;
    }
LAB_001b80a6:
    pFVar3 = pIter->pLeaf;
    if (pFVar3 == (Fts5Data *)0x0) {
      sqlite3_free(p_00);
      goto LAB_001b804d;
    }
    uVar5 = pIter->iLeafOffset;
  }
  bVar2 = sqlite3Fts5GetVarint(pFVar3->p + (int)uVar5,(u64 *)&pIter->iRowid);
  pIter->iLeafOffset = pIter->iLeafOffset + (uint)bVar2;
  goto LAB_001b80e0;
}

Assistant:

static void fts5SegIterReverseNewPage(Fts5Index *p, Fts5SegIter *pIter){
  assert( pIter->flags & FTS5_SEGITER_REVERSE );
  assert( pIter->flags & FTS5_SEGITER_ONETERM );

  fts5DataRelease(pIter->pLeaf);
  pIter->pLeaf = 0;
  while( p->rc==SQLITE_OK && pIter->iLeafPgno>pIter->iTermLeafPgno ){
    Fts5Data *pNew;
    pIter->iLeafPgno--;
    pNew = fts5DataRead(p, FTS5_SEGMENT_ROWID(
          pIter->pSeg->iSegid, pIter->iLeafPgno
    ));
    if( pNew ){
      /* iTermLeafOffset may be equal to szLeaf if the term is the last
      ** thing on the page - i.e. the first rowid is on the following page.
      ** In this case leave pIter->pLeaf==0, this iterator is at EOF. */
      if( pIter->iLeafPgno==pIter->iTermLeafPgno ){
        assert( pIter->pLeaf==0 );
        if( pIter->iTermLeafOffset<pNew->szLeaf ){
          pIter->pLeaf = pNew;
          pIter->iLeafOffset = pIter->iTermLeafOffset;
        }
      }else{
        int iRowidOff;
        iRowidOff = fts5LeafFirstRowidOff(pNew);
        if( iRowidOff ){
          pIter->pLeaf = pNew;
          pIter->iLeafOffset = iRowidOff;
        }
      }

      if( pIter->pLeaf ){
        u8 *a = &pIter->pLeaf->p[pIter->iLeafOffset];
        pIter->iLeafOffset += fts5GetVarint(a, (u64*)&pIter->iRowid);
        break;
      }else{
        fts5DataRelease(pNew);
      }
    }
  }

  if( pIter->pLeaf ){
    pIter->iEndofDoclist = pIter->pLeaf->nn+1;
    fts5SegIterReverseInitPage(p, pIter);
  }
}